

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O2

void __thiscall tf::Executor::_tear_down_topology(Executor *this,Worker *worker,Topology *tpg)

{
  queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
  *this_00;
  Taskflow *pTVar1;
  Topology *pTVar2;
  _Elt_pointer psVar3;
  const_iterator __position;
  bool bVar4;
  size_type sVar5;
  scoped_lock<std::mutex> satellite_lock;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_50;
  Topology *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  pTVar1 = tpg->_taskflow;
  if (((tpg->_exception_ptr)._M_exception_object == (void *)0x0) &&
     (((uint)(tpg->_estate).super___atomic_base<int>._M_i >> 0x1d & 1) == 0)) {
    bVar4 = std::function<bool_()>::operator()(&tpg->_pred);
    if (!bVar4) {
      std::mutex::lock(&pTVar1->_mutex);
      _set_up_topology(this,worker,tpg);
      pthread_mutex_unlock((pthread_mutex_t *)&pTVar1->_mutex);
      return;
    }
  }
  if ((tpg->_call).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_()>::operator()(&tpg->_call);
  }
  std::unique_lock<std::mutex>::unique_lock(&local_50,&pTVar1->_mutex);
  this_00 = &pTVar1->_topologies;
  sVar5 = std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
          ::size(&this_00->c);
  if (sVar5 < 2) {
    psVar3 = (pTVar1->_topologies).c.
             super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    pTVar2 = (psVar3->super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_38._M_pi =
         (psVar3->super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    (psVar3->super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (psVar3->super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)0x0;
    local_40 = pTVar2;
    std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
    pop_front(&this_00->c);
    __position._M_node =
         (pTVar1->_satellite).super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>.
         _M_payload.super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_payload.
         _M_value._M_node;
    bVar4 = (pTVar1->_satellite).super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>
            ._M_payload.super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_engaged;
    std::unique_lock<std::mutex>::unlock(&local_50);
    Topology::_carry_out_promise(pTVar2);
    _decrement_topology(this);
    if ((bVar4 & 1U) != 0) {
      std::mutex::lock(&this->_taskflows_mutex);
      std::__cxx11::list<tf::Taskflow,_std::allocator<tf::Taskflow>_>::erase
                (&this->_taskflows,__position);
      pthread_mutex_unlock((pthread_mutex_t *)this);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  }
  else {
    std::promise<void>::set_value(&tpg->_promise);
    std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
    pop_front(&this_00->c);
    pTVar2 = (((pTVar1->_topologies).c.
               super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur)->
             super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    _decrement_topology(this);
    _set_up_topology(this,worker,pTVar2);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_50);
  return;
}

Assistant:

inline void Executor::_tear_down_topology(Worker& worker, Topology* tpg) {

  auto &f = tpg->_taskflow;

  //assert(&tpg == &(f._topologies.front()));

  // case 1: we still need to run the topology again
  if(!tpg->_exception_ptr && !tpg->cancelled() && !tpg->_pred()) {
    //assert(tpg->_join_counter == 0);
    std::lock_guard<std::mutex> lock(f._mutex);
    _set_up_topology(&worker, tpg);
  }
  // case 2: the final run of this topology
  else {

    // invoke the callback after each run
    if(tpg->_call != nullptr) {
      tpg->_call();
    }

    // If there is another run (interleave between lock)
    if(std::unique_lock<std::mutex> lock(f._mutex); f._topologies.size()>1) {
      //assert(tpg->_join_counter == 0);

      // Set the promise
      tpg->_promise.set_value();
      f._topologies.pop();
      tpg = f._topologies.front().get();

      // decrement the topology
      _decrement_topology();

      // set up topology needs to be under the lock or it can
      // introduce memory order error with pop
      _set_up_topology(&worker, tpg);
    }
    else {
      //assert(f._topologies.size() == 1);

      auto fetched_tpg {std::move(f._topologies.front())};
      f._topologies.pop();
      auto satellite {f._satellite};

      lock.unlock();
      
      // Soon after we carry out the promise, there is no longer any guarantee
      // for the lifetime of the associated taskflow.
      fetched_tpg->_carry_out_promise();

      _decrement_topology();

      // remove the taskflow if it is managed by the executor
      // TODO: in the future, we may need to synchronize on wait
      // (which means the following code should the moved before set_value)
      if(satellite) {
        std::scoped_lock<std::mutex> satellite_lock(_taskflows_mutex);
        _taskflows.erase(*satellite);
      }
    }
  }
}